

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv_tcp_bind(uv_tcp_t *handle,sockaddr *addr)

{
  uv_tcp_t *in_RSI;
  long in_RDI;
  uint addrlen;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  int local_4;
  
  if (*(int *)(in_RDI + 0x18) == 0xc) {
    if (*(short *)&in_RSI->close_cb == 2) {
      uVar1 = 0x10;
    }
    else {
      if (*(short *)&in_RSI->close_cb != 10) {
        return -0x16;
      }
      uVar1 = 0x1c;
    }
    local_4 = uv__tcp_bind(in_RSI,(sockaddr *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
  }
  else {
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int uv_tcp_bind(uv_tcp_t* handle, const struct sockaddr* addr) {
  unsigned int addrlen;

  if (handle->type != UV_TCP)
    return UV_EINVAL;

  if (addr->sa_family == AF_INET)
    addrlen = sizeof(struct sockaddr_in);
  else if (addr->sa_family == AF_INET6)
    addrlen = sizeof(struct sockaddr_in6);
  else
    return UV_EINVAL;

  return uv__tcp_bind(handle, addr, addrlen);
}